

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O3

void agentf_try_forward(agentf *af)

{
  bufchain *ch;
  size_t sVar1;
  strbuf *buf_o;
  void *data;
  agent_pending_query *paVar2;
  char *pcVar3;
  uint uVar4;
  int replylen;
  uchar msglen [4];
  void *reply;
  int local_40;
  uint local_3c;
  char *local_38;
  ulong len;
  
  if (af->pending != (agent_pending_query *)0x0) {
    return;
  }
  if (af->input_wanted == true) {
    ch = &af->inbuffer;
    sVar1 = bufchain_size(ch);
    if (3 < sVar1) {
      do {
        bufchain_fetch(ch,&local_3c,4);
        uVar4 = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                local_3c << 0x18;
        len = (ulong)uVar4;
        if (0x3fffc < uVar4) {
          af->pending = (agent_pending_query *)0x0;
          (*af->c->vt->write)(af->c,false,"",5);
          goto LAB_0013aba8;
        }
        if (sVar1 - 4 < len) break;
        bufchain_consume(ch,4);
        buf_o = strbuf_new_for_agent_query();
        data = strbuf_append(buf_o,len);
        bufchain_fetch_consume(ch,data,len);
        paVar2 = agent_query(buf_o,&local_38,&local_40,agentf_callback,af);
        af->pending = paVar2;
        strbuf_free(buf_o);
        if (af->pending != (agent_pending_query *)0x0) {
          return;
        }
        sVar1 = (size_t)local_40;
        pcVar3 = local_38;
        if (local_38 == (char *)0x0) {
          pcVar3 = "";
        }
        if (local_38 == (char *)0x0) {
          sVar1 = 5;
        }
        (*af->c->vt->write)(af->c,false,pcVar3,sVar1);
        safefree(local_38);
        sVar1 = bufchain_size(ch);
      } while (3 < sVar1);
    }
    if (af->rcvd_eof == true) {
LAB_0013aba8:
      (*af->c->vt->write_eof)(af->c);
    }
  }
  return;
}

Assistant:

static void agentf_try_forward(agentf *af)
{
    size_t datalen, length;
    strbuf *message;
    unsigned char msglen[4];
    void *reply;
    int replylen;

    /*
     * Don't try to parallelise agent requests. Wait for each one to
     * return before attempting the next.
     */
    if (af->pending)
        return;

    /*
     * If the outgoing side of the channel connection is currently
     * throttled, don't submit any new forwarded requests to the real
     * agent. This causes the input side of the agent forwarding not
     * to be emptied, exerting the required back-pressure on the
     * remote client, and encouraging it to read our responses before
     * sending too many more requests.
     */
    if (!af->input_wanted)
        return;

    while (1) {
        /*
         * Try to extract a complete message from the input buffer.
         */
        datalen = bufchain_size(&af->inbuffer);
        if (datalen < 4)
            break;         /* not even a length field available yet */

        bufchain_fetch(&af->inbuffer, msglen, 4);
        length = GET_32BIT_MSB_FIRST(msglen);

        if (length > AGENT_MAX_MSGLEN-4) {
            /*
             * If the remote has sent a message that's just _too_
             * long, we should reject it in advance of seeing the rest
             * of the incoming message, and also close the connection
             * for good measure (which avoids us having to faff about
             * with carefully ignoring just the right number of bytes
             * from the overlong message).
             */
            agentf_got_response(af, NULL, 0);
            sshfwd_write_eof(af->c);
            return;
        }

        if (length > datalen - 4)
            break;          /* a whole message is not yet available */

        bufchain_consume(&af->inbuffer, 4);

        message = strbuf_new_for_agent_query();
        bufchain_fetch_consume(
            &af->inbuffer, strbuf_append(message, length), length);
        af->pending = agent_query(
            message, &reply, &replylen, agentf_callback, af);
        strbuf_free(message);

        if (af->pending)
            return;   /* agent_query promised to reply in due course */

        /*
         * If the agent gave us an answer immediately, pass it
         * straight on and go round this loop again.
         */
        agentf_got_response(af, reply, replylen);
        sfree(reply);
    }

    /*
     * If we get here (i.e. we left the above while loop via 'break'
     * rather than 'return'), that means we've determined that the
     * input buffer for the agent forwarding connection doesn't
     * contain a complete request.
     *
     * So if there's potentially more data to come, we can return now,
     * and wait for the remote client to send it. But if the remote
     * has sent EOF, it would be a mistake to do that, because we'd be
     * waiting a long time. So this is the moment to check for EOF,
     * and respond appropriately.
     */
    if (af->rcvd_eof)
        sshfwd_write_eof(af->c);
}